

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O3

void __thiscall CTB<UF>::FirstScan(CTB<UF> *this)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  Mat1i *pMVar4;
  Mat1b *pMVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  uint uVar16;
  long lVar17;
  uint *puVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  *UF::P_ = 0;
  UF::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar13 = (ulong)*(int *)&pMVar5->field_0x8;
  if (0 < (long)uVar13) {
    uVar3 = *(uint *)&pMVar5->field_0xc;
    lVar10 = (long)(int)uVar3;
    uVar12 = 0;
    do {
      if (0 < (int)uVar3) {
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        lVar25 = **(long **)&pMVar5->field_0x48;
        lVar22 = lVar25 * uVar12 + *(long *)&pMVar5->field_0x10;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar23 = lVar22 - lVar25;
        lVar25 = lVar25 + lVar22;
        lVar6 = *(long *)&pMVar4->field_0x10;
        lVar7 = **(long **)&pMVar4->field_0x48;
        lVar1 = lVar6 + lVar7 * uVar12;
        lVar20 = lVar1 - lVar7;
        lVar2 = lVar1 + lVar7;
        lVar11 = lVar7 + lVar1 + -4;
        uVar19 = uVar12 | 1;
        uVar15 = 0xffffffff;
        uVar14 = 0;
        iVar9 = -1;
        do {
          switch(uVar15) {
          default:
            goto switchD_001ad1b2_caseD_0;
          case 1:
            if (*(char *)(lVar22 + uVar14) != '\0') {
              if (uVar12 == 0) {
LAB_001adac6:
                UF::P_[UF::length_] = UF::length_;
                uVar26 = UF::length_ + 1;
                *(uint *)(lVar1 + uVar14 * 4) = UF::length_;
                UF::length_ = uVar26;
LAB_001adae7:
                iVar9 = 6;
              }
              else if (*(char *)(lVar23 + uVar14) == '\0') {
                if ((lVar10 <= (long)(uVar14 + 1)) || (*(char *)(lVar23 + uVar14 + 1) == '\0')) {
                  if ((uVar14 == 0) || (*(char *)((uVar14 - 1) + lVar23) == '\0'))
                  goto LAB_001adac6;
                  *(undefined4 *)(lVar1 + uVar14 * 4) = *(undefined4 *)(lVar20 + -4 + uVar14 * 4);
                  goto LAB_001adae7;
                }
                uVar26 = *(uint *)(lVar20 + 4 + uVar14 * 4);
                *(uint *)(lVar1 + uVar14 * 4) = uVar26;
                iVar9 = 5;
                if ((uVar14 != 0) && (*(char *)((uVar14 - 1) + lVar23) != '\0')) {
                  do {
                    uVar16 = uVar26;
                    uVar26 = UF::P_[uVar16];
                    uVar8 = *(uint *)(lVar20 + -4 + uVar14 * 4);
                  } while (UF::P_[uVar16] < uVar16);
                  do {
                    uVar26 = uVar8;
                    uVar8 = UF::P_[uVar26];
                  } while (UF::P_[uVar26] < uVar26);
                  if (uVar16 < uVar26) {
                    UF::P_[uVar26] = uVar16;
                  }
                  else {
                    UF::P_[uVar16] = uVar26;
                  }
                }
              }
              else {
                *(undefined4 *)(lVar1 + uVar14 * 4) = *(undefined4 *)(lVar20 + uVar14 * 4);
                iVar9 = 4;
              }
              uVar15 = 2;
              break;
            }
            uVar15 = 1;
            if ((uVar19 < uVar13) && (*(char *)(lVar25 + uVar14) != '\0')) {
              UF::P_[UF::length_] = UF::length_;
              uVar26 = UF::length_ + 1;
              *(uint *)(lVar2 + uVar14 * 4) = UF::length_;
              UF::length_ = uVar26;
              uVar15 = 3;
            }
            goto switchD_001ad1b2_caseD_0;
          case 2:
            if (*(char *)(lVar22 + uVar14) != '\0') {
              uVar15 = 2;
              if (iVar9 == 6) {
                uVar26 = *(uint *)(lVar1 + -4 + uVar14 * 4);
                *(uint *)(lVar1 + uVar14 * 4) = uVar26;
                if (((uVar12 != 0) && ((long)(uVar14 + 1) < lVar10)) &&
                   (*(char *)(lVar23 + uVar14 + 1) != '\0')) {
                  do {
                    uVar16 = uVar26;
                    uVar24 = (ulong)uVar16;
                    uVar26 = UF::P_[uVar24];
                    uVar8 = *(uint *)(lVar20 + 4 + uVar14 * 4);
                  } while (UF::P_[uVar24] < uVar16);
                  do {
                    uVar26 = uVar8;
                    uVar21 = (ulong)uVar26;
                    uVar8 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar26);
                  goto LAB_001ad86a;
                }
LAB_001ad87c:
                iVar9 = 6;
              }
              else if (iVar9 == 5) {
LAB_001ad60c:
                *(undefined4 *)(lVar1 + uVar14 * 4) = *(undefined4 *)(lVar1 + -4 + uVar14 * 4);
                iVar9 = 5;
                uVar15 = 5;
              }
              else if (iVar9 == 4) {
                uVar26 = *(uint *)(lVar1 + -4 + uVar14 * 4);
                *(uint *)(lVar1 + uVar14 * 4) = uVar26;
                iVar9 = 6;
                uVar15 = 4;
                if (uVar12 != 0) {
                  if (*(char *)(lVar23 + uVar14) == '\0') {
                    if (((long)(uVar14 + 1) < lVar10) && (*(char *)(lVar23 + uVar14 + 1) != '\0')) {
                      do {
                        uVar16 = uVar26;
                        uVar24 = (ulong)uVar16;
                        uVar26 = UF::P_[uVar24];
                        uVar8 = *(uint *)(lVar20 + 4 + uVar14 * 4);
                      } while (UF::P_[uVar24] < uVar16);
                      do {
                        uVar26 = uVar8;
                        uVar21 = (ulong)uVar26;
                        uVar8 = UF::P_[uVar21];
                      } while (UF::P_[uVar21] < uVar26);
LAB_001adc5c:
                      uVar15 = 4;
                      if (uVar16 < uVar26) {
                        UF::P_[uVar21] = uVar16;
                      }
                      else {
                        UF::P_[uVar24] = uVar26;
                      }
                      goto LAB_001adda6;
                    }
                  }
                  else {
LAB_001ad5bc:
                    uVar15 = 4;
                    iVar9 = 4;
                  }
                }
              }
              break;
            }
LAB_001ad5c6:
            uVar15 = 1;
            if ((uVar19 < uVar13) && (*(char *)(lVar25 + uVar14) != '\0')) {
              *(undefined4 *)(lVar2 + uVar14 * 4) =
                   *(undefined4 *)(lVar6 + lVar7 * uVar12 + -4 + uVar14 * 4);
              goto LAB_001ad5ec;
            }
            goto switchD_001ad1b2_caseD_0;
          case 3:
            if (*(char *)(lVar22 + uVar14) == '\0') {
LAB_001ad541:
              uVar15 = 1;
              if ((uVar19 < uVar13) && (*(char *)(lVar25 + uVar14) != '\0')) {
                *(undefined4 *)(lVar2 + uVar14 * 4) = *(undefined4 *)(lVar2 + -4 + uVar14 * 4);
                uVar15 = 9;
              }
              goto switchD_001ad1b2_caseD_0;
            }
            if (uVar12 == 0) {
LAB_001ad5f6:
              *(undefined4 *)(lVar1 + uVar14 * 4) = *(undefined4 *)(lVar11 + uVar14 * 4);
              iVar9 = 6;
            }
            else if (*(char *)(lVar23 + uVar14) == '\0') {
              if (((long)(uVar14 + 1) < lVar10) && (*(char *)(lVar23 + uVar14 + 1) != '\0')) {
                uVar26 = *(uint *)(lVar20 + 4 + uVar14 * 4);
                *(uint *)(lVar1 + uVar14 * 4) = uVar26;
                puVar18 = UF::P_;
                do {
                  uVar16 = uVar26;
                  uVar26 = UF::P_[uVar16];
                  uVar8 = *(uint *)(lVar2 + -4 + uVar14 * 4);
                } while (UF::P_[uVar16] < uVar16);
                do {
                  uVar26 = uVar8;
                  uVar8 = UF::P_[uVar26];
                } while (UF::P_[uVar26] < uVar26);
                if (uVar16 < uVar26) {
                  UF::P_[uVar26] = uVar16;
                }
                else {
                  UF::P_[uVar16] = uVar26;
                }
                iVar9 = 5;
                if ((uVar14 != 0) && (*(char *)(lVar23 + -1 + uVar14) != '\0')) {
                  uVar26 = *(uint *)(lVar1 + uVar14 * 4);
                  do {
                    uVar16 = uVar26;
                    uVar24 = (ulong)uVar16;
                    uVar26 = puVar18[uVar24];
                    uVar8 = *(uint *)(lVar20 + -4 + uVar14 * 4);
                  } while (puVar18[uVar24] < uVar16);
                  do {
                    uVar26 = uVar8;
                    uVar21 = (ulong)uVar26;
                    uVar8 = puVar18[uVar21];
                  } while (puVar18[uVar21] < uVar26);
                  goto LAB_001add89;
                }
              }
              else {
                uVar26 = *(uint *)(lVar2 + -4 + uVar14 * 4);
                *(uint *)(lVar1 + uVar14 * 4) = uVar26;
                iVar9 = 6;
                if ((uVar14 != 0) && (*(char *)(lVar23 + -1 + uVar14) != '\0')) {
                  do {
                    uVar16 = uVar26;
                    uVar24 = (ulong)uVar16;
                    uVar26 = UF::P_[uVar24];
                    uVar8 = *(uint *)(lVar20 + -4 + uVar14 * 4);
                  } while (UF::P_[uVar24] < uVar16);
                  do {
                    uVar26 = uVar8;
                    uVar21 = (ulong)uVar26;
                    puVar18 = UF::P_;
                    uVar8 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar26);
                  goto LAB_001add89;
                }
LAB_001adbfd:
                iVar9 = 6;
              }
            }
            else {
              uVar26 = *(uint *)(lVar20 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = UF::P_[uVar24];
                uVar8 = *(uint *)(lVar11 + uVar14 * 4);
              } while (UF::P_[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                uVar8 = UF::P_[uVar21];
              } while (UF::P_[uVar21] < uVar26);
LAB_001ad52f:
              if (uVar16 < uVar26) {
                UF::P_[uVar21] = uVar16;
              }
              else {
                UF::P_[uVar24] = uVar26;
              }
              iVar9 = 4;
            }
            goto LAB_001ad6c7;
          case 4:
            if (*(char *)(lVar22 + uVar14) == '\0') goto LAB_001ad5c6;
            uVar15 = 4;
            if (iVar9 == 6) {
              uVar26 = *(uint *)(lVar1 + -4 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              if (((uVar12 == 0) || (lVar10 <= (long)(uVar14 + 1))) ||
                 (*(char *)(lVar23 + uVar14 + 1) == '\0')) goto LAB_001ad87c;
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = UF::P_[uVar24];
                uVar8 = *(uint *)(lVar20 + 4 + uVar14 * 4);
              } while (UF::P_[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                uVar8 = UF::P_[uVar21];
              } while (UF::P_[uVar21] < uVar26);
LAB_001ad86a:
              if (uVar16 < uVar26) {
                UF::P_[uVar21] = uVar16;
              }
              else {
                UF::P_[uVar24] = uVar26;
              }
LAB_001adda6:
              iVar9 = 5;
            }
            else {
              if (iVar9 == 5) goto LAB_001ad60c;
              if (iVar9 == 4) {
                uVar26 = *(uint *)(lVar1 + -4 + uVar14 * 4);
                *(uint *)(lVar1 + uVar14 * 4) = uVar26;
                iVar9 = 6;
                if (uVar12 != 0) {
                  uVar15 = 4;
                  if (*(char *)(lVar23 + uVar14) != '\0') goto LAB_001ad5bc;
                  if (((long)(uVar14 + 1) < lVar10) && (*(char *)(lVar23 + uVar14 + 1) != '\0')) {
                    do {
                      uVar16 = uVar26;
                      uVar24 = (ulong)uVar16;
                      uVar26 = UF::P_[uVar24];
                      uVar8 = *(uint *)(lVar20 + 4 + uVar14 * 4);
                    } while (UF::P_[uVar24] < uVar16);
                    do {
                      uVar26 = uVar8;
                      uVar21 = (ulong)uVar26;
                      uVar8 = UF::P_[uVar21];
                    } while (UF::P_[uVar21] < uVar26);
                    goto LAB_001adc5c;
                  }
                }
              }
            }
            break;
          case 5:
            if (*(char *)(lVar22 + uVar14) == '\0') goto LAB_001ad5c6;
            uVar26 = *(uint *)(lVar1 + -4 + uVar14 * 4);
            *(uint *)(lVar1 + uVar14 * 4) = uVar26;
            if (uVar12 == 0) {
LAB_001ad6d1:
              iVar9 = 6;
            }
            else {
              iVar9 = 4;
              if (*(char *)(lVar23 + uVar14) == '\0') {
                if (lVar10 <= (long)(uVar14 + 1)) goto LAB_001ad6d1;
                iVar9 = 6;
                if (*(char *)(lVar23 + uVar14 + 1) != '\0') {
                  do {
                    uVar16 = uVar26;
                    uVar26 = UF::P_[uVar16];
                    uVar8 = *(uint *)(lVar20 + 4 + uVar14 * 4);
                  } while (UF::P_[uVar16] < uVar16);
                  do {
                    uVar26 = uVar8;
                    uVar8 = UF::P_[uVar26];
                  } while (UF::P_[uVar26] < uVar26);
                  if (uVar16 < uVar26) {
                    UF::P_[uVar26] = uVar16;
                  }
                  else {
                    UF::P_[uVar16] = uVar26;
                  }
                  iVar9 = 5;
                }
              }
            }
            uVar15 = 4;
            break;
          case 6:
            if (*(char *)(lVar22 + uVar14) == '\0') goto LAB_001ad5c6;
            if (iVar9 == 6) {
              uVar26 = *(uint *)(lVar1 + -4 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              uVar15 = 6;
              if (((uVar12 == 0) || (lVar10 <= (long)(uVar14 + 1))) ||
                 (*(char *)(lVar23 + uVar14 + 1) == '\0')) goto LAB_001ad87c;
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = UF::P_[uVar24];
                uVar8 = *(uint *)(lVar20 + 4 + uVar14 * 4);
              } while (UF::P_[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                uVar8 = UF::P_[uVar21];
              } while (UF::P_[uVar21] < uVar26);
              goto LAB_001ad86a;
            }
            uVar15 = 6;
            if (iVar9 == 5) goto LAB_001ad60c;
            break;
          case 7:
            if (*(char *)(lVar22 + uVar14) == '\0') goto LAB_001ad541;
            if (uVar12 == 0) goto LAB_001ad5f6;
            if (*(char *)(lVar23 + uVar14) != '\0') {
              uVar26 = *(uint *)(lVar20 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = UF::P_[uVar24];
                uVar8 = *(uint *)(lVar11 + uVar14 * 4);
              } while (UF::P_[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                uVar8 = UF::P_[uVar21];
              } while (UF::P_[uVar21] < uVar26);
              goto LAB_001ad52f;
            }
            if (((long)(uVar14 + 1) < lVar10) && (*(char *)(lVar23 + uVar14 + 1) != '\0')) {
              uVar26 = *(uint *)(lVar20 + 4 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              puVar18 = UF::P_;
              do {
                uVar16 = uVar26;
                uVar26 = UF::P_[uVar16];
                uVar8 = *(uint *)(lVar2 + -4 + uVar14 * 4);
              } while (UF::P_[uVar16] < uVar16);
              do {
                uVar26 = uVar8;
                uVar8 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              if (uVar16 < uVar26) {
                UF::P_[uVar26] = uVar16;
              }
              else {
                UF::P_[uVar16] = uVar26;
              }
              iVar9 = 5;
              if ((uVar14 == 0) || (*(char *)(lVar23 + -1 + uVar14) == '\0')) goto LAB_001ad6c7;
              uVar26 = *(uint *)(lVar1 + uVar14 * 4);
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = puVar18[uVar24];
                uVar8 = *(uint *)(lVar20 + -4 + uVar14 * 4);
              } while (puVar18[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                uVar8 = puVar18[uVar21];
              } while (puVar18[uVar21] < uVar26);
            }
            else {
              uVar26 = *(uint *)(lVar2 + -4 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              iVar9 = 6;
              if ((uVar14 == 0) || (*(char *)(lVar23 + -1 + uVar14) == '\0')) goto LAB_001adbfd;
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = UF::P_[uVar24];
                uVar8 = *(uint *)(lVar20 + -4 + uVar14 * 4);
              } while (UF::P_[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                puVar18 = UF::P_;
                uVar8 = UF::P_[uVar21];
              } while (UF::P_[uVar21] < uVar26);
            }
            goto LAB_001add89;
          case 8:
            if (*(char *)(lVar22 + uVar14) == '\0') goto LAB_001ad5c6;
            uVar15 = 8;
            if (iVar9 == 6) {
              uVar26 = *(uint *)(lVar1 + -4 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              if (((uVar12 == 0) || (lVar10 <= (long)(uVar14 + 1))) ||
                 (*(char *)(lVar23 + uVar14 + 1) == '\0')) goto LAB_001ad87c;
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = UF::P_[uVar24];
                uVar8 = *(uint *)(lVar20 + 4 + uVar14 * 4);
              } while (UF::P_[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                uVar8 = UF::P_[uVar21];
              } while (UF::P_[uVar21] < uVar26);
              goto LAB_001ad86a;
            }
            if (iVar9 == 5) goto LAB_001ad60c;
            if (iVar9 == 4) {
              uVar26 = *(uint *)(lVar1 + -4 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              iVar9 = 6;
              uVar15 = 4;
              if (uVar12 != 0) {
                if (*(char *)(lVar23 + uVar14) != '\0') goto LAB_001ad5bc;
                if (((long)(uVar14 + 1) < lVar10) && (*(char *)(lVar23 + uVar14 + 1) != '\0')) {
                  do {
                    uVar16 = uVar26;
                    uVar24 = (ulong)uVar16;
                    uVar26 = UF::P_[uVar24];
                    uVar8 = *(uint *)(lVar20 + 4 + uVar14 * 4);
                  } while (UF::P_[uVar24] < uVar16);
                  do {
                    uVar26 = uVar8;
                    uVar21 = (ulong)uVar26;
                    uVar8 = UF::P_[uVar21];
                  } while (UF::P_[uVar21] < uVar26);
                  goto LAB_001adc5c;
                }
              }
            }
            break;
          case 9:
            if (*(char *)(lVar22 + uVar14) == '\0') goto LAB_001ad541;
            if (uVar12 == 0) goto LAB_001ad5f6;
            if (*(char *)(lVar23 + uVar14) != '\0') {
              uVar26 = *(uint *)(lVar20 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = UF::P_[uVar24];
                uVar8 = *(uint *)(lVar11 + uVar14 * 4);
              } while (UF::P_[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                uVar8 = UF::P_[uVar21];
              } while (UF::P_[uVar21] < uVar26);
              goto LAB_001ad52f;
            }
            if (((long)(uVar14 + 1) < lVar10) && (*(char *)(lVar23 + uVar14 + 1) != '\0')) {
              uVar26 = *(uint *)(lVar20 + 4 + uVar14 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              puVar18 = UF::P_;
              do {
                uVar16 = uVar26;
                uVar26 = UF::P_[uVar16];
                uVar8 = *(uint *)(lVar2 + -4 + uVar14 * 4);
              } while (UF::P_[uVar16] < uVar16);
              do {
                uVar26 = uVar8;
                uVar8 = UF::P_[uVar26];
              } while (UF::P_[uVar26] < uVar26);
              if (uVar16 < uVar26) {
                UF::P_[uVar26] = uVar16;
              }
              else {
                UF::P_[uVar16] = uVar26;
              }
              iVar9 = 5;
              if ((uVar14 == 0) || (*(char *)(lVar23 + -1 + uVar14) == '\0')) goto LAB_001ad6c7;
              uVar26 = *(uint *)(lVar1 + uVar14 * 4);
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = puVar18[uVar24];
                uVar8 = *(uint *)(lVar20 + -4 + uVar14 * 4);
              } while (puVar18[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                uVar8 = puVar18[uVar21];
              } while (puVar18[uVar21] < uVar26);
            }
            else {
              iVar9 = 6;
              lVar17 = uVar14 - 1;
              uVar26 = *(uint *)(lVar2 + lVar17 * 4);
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              if ((uVar14 == 0) || (*(char *)(lVar23 + lVar17) == '\0')) goto LAB_001adbfd;
              do {
                uVar16 = uVar26;
                uVar24 = (ulong)uVar16;
                uVar26 = UF::P_[uVar24];
                uVar8 = *(uint *)(lVar20 + lVar17 * 4);
              } while (UF::P_[uVar24] < uVar16);
              do {
                uVar26 = uVar8;
                uVar21 = (ulong)uVar26;
                puVar18 = UF::P_;
                uVar8 = UF::P_[uVar21];
              } while (UF::P_[uVar21] < uVar26);
            }
LAB_001add89:
            if (uVar16 < uVar26) {
              puVar18[uVar21] = uVar16;
            }
            else {
              puVar18[uVar24] = uVar26;
            }
LAB_001ad6c7:
            uVar15 = 8;
            break;
          case 0xffffffff:
            if (*(char *)(lVar22 + uVar14) == '\0') {
              uVar15 = 1;
              if ((uVar19 < uVar13) && (*(char *)(lVar25 + uVar14) != '\0')) {
                UF::P_[UF::length_] = UF::length_;
                uVar26 = UF::length_ + 1;
                *(uint *)(lVar2 + uVar14 * 4) = UF::length_;
                UF::length_ = uVar26;
LAB_001ad5ec:
                uVar15 = 7;
              }
            }
            else {
              if (uVar12 == 0) {
LAB_001ad8a8:
                UF::P_[UF::length_] = UF::length_;
                iVar9 = 6;
                uVar26 = UF::length_;
                UF::length_ = UF::length_ + 1;
              }
              else if (*(char *)(lVar23 + uVar14) == '\0') {
                if ((lVar10 <= (long)(uVar14 + 1)) || (*(char *)(lVar23 + uVar14 + 1) == '\0'))
                goto LAB_001ad8a8;
                iVar9 = 5;
                uVar26 = *(uint *)(lVar20 + 4 + uVar14 * 4);
              }
              else {
                iVar9 = 4;
                uVar26 = *(uint *)(lVar20 + uVar14 * 4);
              }
              *(uint *)(lVar1 + uVar14 * 4) = uVar26;
              uVar15 = 2;
              if ((uVar19 < uVar13) && (*(char *)(lVar25 + uVar14) != '\0')) {
                *(uint *)(lVar2 + uVar14 * 4) = uVar26;
              }
            }
            goto switchD_001ad1b2_caseD_0;
          }
          if ((uVar19 < uVar13) && (*(char *)(lVar25 + uVar14) != '\0')) {
            *(undefined4 *)(lVar2 + uVar14 * 4) = *(undefined4 *)(lVar1 + uVar14 * 4);
          }
switchD_001ad1b2_caseD_0:
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar3);
      }
      uVar12 = uVar12 + 2;
    } while (uVar12 < uVar13);
  }
  return;
}

Assistant:

void FirstScan() 
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5
    }